

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_wraith.cpp
# Opt level: O2

int AF_A_WraithInit(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *pDVar2;
  bool bVar3;
  DObject *this;
  char *__assertion;
  PClass *pPVar4;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00544acc;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this == (DObject *)0x0) {
LAB_00544a08:
        this = (DObject *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00544acc;
        }
      }
      if (numparam == 1) goto LAB_00544a79;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_00544abc;
        pDVar2 = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (pDVar2 != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(pDVar2,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00544acc;
            }
          }
        }
        else if (pDVar2 != (DObject *)0x0) goto LAB_00544abc;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00544a79:
        pDVar2 = this[7].ObjNext;
        pPVar4 = (PClass *)((double)this[2].Class + 48.0);
        this[2].Class = pPVar4;
        if ((double)pDVar2 < (double)pPVar4 + *(double *)&this[8].ObjectFlags) {
          this[2].Class = (PClass *)((double)pDVar2 - *(double *)&this[8].ObjectFlags);
        }
        *(undefined1 *)((long)&this[0xe]._vptr_DObject + 1) = 0;
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_00544acc;
    }
    if (this == (DObject *)0x0) goto LAB_00544a08;
  }
LAB_00544abc:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00544acc:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                ,0x1a,"int AF_A_WraithInit(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WraithInit)
{
	PARAM_ACTION_PROLOGUE;

	self->AddZ(48);

	// [RH] Make sure the wraith didn't go into the ceiling
	if (self->Top() > self->ceilingz)
	{
		self->SetZ(self->ceilingz - self->Height);
	}

	self->WeaveIndexZ = 0;			// index into floatbob
	return 0;
}